

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

wchar_t fl_utf8locale(void)

{
  char *pcVar1;
  bool local_11;
  char *local_10;
  char *s;
  
  if (fl_utf8locale::ret == L'\x02') {
    fl_utf8locale::ret = L'\x01';
    local_10 = getenv("LC_CTYPE");
    if ((((local_10 != (char *)0x0) && (*local_10 != '\0')) ||
        ((local_10 = getenv("LC_ALL"), local_10 != (char *)0x0 && (*local_10 != '\0')))) ||
       ((local_10 = getenv("LANG"), local_10 != (char *)0x0 && (*local_10 != '\0')))) {
      pcVar1 = strstr(local_10,"utf");
      local_11 = true;
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strstr(local_10,"UTF");
        local_11 = pcVar1 != (char *)0x0;
      }
      fl_utf8locale::ret = (wchar_t)local_11;
    }
  }
  return fl_utf8locale::ret;
}

Assistant:

int fl_utf8locale(void) {
  static int ret = 2;
  if (ret == 2) {
#ifdef WIN32
    ret = GetACP() == CP_UTF8;
#else
    char* s;
    ret = 1; /* assume UTF-8 if no locale */
    if (((s = getenv("LC_CTYPE")) && *s) ||
	((s = getenv("LC_ALL"))   && *s) ||
	((s = getenv("LANG"))     && *s)) {
      ret = (strstr(s,"utf") || strstr(s,"UTF"));
    }
#endif
  }
  return ret;
}